

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall
TxConfirmStats::TxConfirmStats
          (TxConfirmStats *this,vector<double,_std::allocator<double>_> *defaultBuckets,
          map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
          *defaultBucketMap,uint maxPeriods,double _decay,uint _scale)

{
  long lVar1;
  uint in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  uint i;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff60;
  undefined8 *__new_size;
  TxConfirmStats *in_stack_ffffffffffffff68;
  uint local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  std::vector<double,_std::allocator<double>_>::vector(in_stack_ffffffffffffff48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_ffffffffffffff48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_ffffffffffffff48);
  std::vector<double,_std::allocator<double>_>::vector(in_stack_ffffffffffffff48);
  in_RDI[0xe] = in_XMM0_Qa;
  *(int *)(in_RDI + 0xf) = in_R8D;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_ffffffffffffff48);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff48);
  if (in_R8D == 0) {
    __assert_fail("_scale != 0 && \"_scale must be non-zero\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                  ,0xb4,
                  "TxConfirmStats::TxConfirmStats(const std::vector<double> &, const std::map<double, unsigned int> &, unsigned int, double, unsigned int)"
                 );
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  for (local_48 = 0; local_48 < in_ECX; local_48 = local_48 + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::vector<double,_std::allocator<double>_>::size(in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff68 =
         (TxConfirmStats *)
         std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::operator[](in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::vector<double,_std::allocator<double>_>::size(in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
  }
  __new_size = in_RDI + 2;
  std::vector<double,_std::allocator<double>_>::size(in_stack_ffffffffffffff48);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff68,
             (size_type)__new_size);
  std::vector<double,_std::allocator<double>_>::size(in_stack_ffffffffffffff48);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff68,
             (size_type)__new_size);
  std::vector<double,_std::allocator<double>_>::size(in_stack_ffffffffffffff48);
  resizeInMemoryCounters(in_stack_ffffffffffffff68,(size_t)__new_size);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

TxConfirmStats::TxConfirmStats(const std::vector<double>& defaultBuckets,
                                const std::map<double, unsigned int>& defaultBucketMap,
                               unsigned int maxPeriods, double _decay, unsigned int _scale)
    : buckets(defaultBuckets), bucketMap(defaultBucketMap), decay(_decay), scale(_scale)
{
    assert(_scale != 0 && "_scale must be non-zero");
    confAvg.resize(maxPeriods);
    failAvg.resize(maxPeriods);
    for (unsigned int i = 0; i < maxPeriods; i++) {
        confAvg[i].resize(buckets.size());
        failAvg[i].resize(buckets.size());
    }

    txCtAvg.resize(buckets.size());
    m_feerate_avg.resize(buckets.size());

    resizeInMemoryCounters(buckets.size());
}